

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O1

SinkFinalizeType __thiscall
duckdb::PhysicalHashAggregate::FinalizeDistinct
          (PhysicalHashAggregate *this,Pipeline *pipeline,Event *event,ClientContext *context,
          GlobalSinkState *gstate_p)

{
  const_reference pvVar1;
  type pDVar2;
  reference pvVar3;
  type pDVar4;
  reference pvVar5;
  reference this_00;
  type gstate_p_00;
  pointer this_01;
  size_type __n;
  size_type __n_00;
  shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_true> new_event;
  undefined1 local_b1;
  PhysicalHashAggregate *local_b0;
  HashAggregateGlobalSinkState *local_a8;
  ClientContext *local_a0;
  shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_true> local_98;
  Pipeline *local_80;
  Event *local_78;
  GlobalSinkState *local_70;
  vector<duckdb::HashAggregateGroupingData,_true> *local_68;
  size_type local_60;
  shared_ptr<duckdb::Event,_true> local_58;
  shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent> local_40;
  
  local_b0 = this;
  local_a8 = (HashAggregateGlobalSinkState *)gstate_p;
  local_a0 = context;
  local_80 = pipeline;
  local_78 = event;
  if ((this->groupings).
      super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      .
      super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->groupings).
      super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      .
      super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_68 = &this->groupings;
    local_70 = gstate_p + 1;
    __n = 0;
    do {
      pvVar1 = vector<duckdb::HashAggregateGroupingData,_true>::operator[](local_68,__n);
      pDVar2 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
               ::operator*(&pvVar1->distinct_data);
      local_60 = __n;
      pvVar3 = vector<duckdb::HashAggregateGroupingGlobalState,_true>::operator[]
                         ((vector<duckdb::HashAggregateGroupingGlobalState,_true> *)local_70,__n);
      pDVar4 = unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
               ::operator*(&pvVar3->distinct_state);
      if ((pDVar2->radix_tables).
          super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (pDVar2->radix_tables).
          super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        __n_00 = 0;
        do {
          pvVar5 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                   ::operator[](&pDVar2->radix_tables,__n_00);
          if ((pvVar5->
              super_unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::RadixPartitionedHashTable_*,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
              .super__Head_base<0UL,_duckdb::RadixPartitionedHashTable_*,_false>._M_head_impl !=
              (RadixPartitionedHashTable *)0x0) {
            pvVar5 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                     ::operator[](&pDVar2->radix_tables,__n_00);
            this_00 = vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
                      ::operator[](&pDVar4->radix_states,__n_00);
            gstate_p_00 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                          ::operator*(this_00);
            this_01 = unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                      ::operator->(pvVar5);
            RadixPartitionedHashTable::Finalize(this_01,local_a0,gstate_p_00);
          }
          __n_00 = __n_00 + 1;
        } while (__n_00 < (ulong)((long)(pDVar2->radix_tables).
                                        super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
                                        .
                                        super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pDVar2->radix_tables).
                                        super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
                                        .
                                        super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      __n = local_60 + 1;
    } while (__n < (ulong)(((long)(local_b0->groupings).
                                  super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                  .
                                  super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(local_b0->groupings).
                                  super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                  .
                                  super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) *
                          0x6db6db6db6db6db7));
  }
  local_40.
  super___shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::HashAggregateDistinctFinalizeEvent,std::allocator<duckdb::HashAggregateDistinctFinalizeEvent>,duckdb::ClientContext&,duckdb::Pipeline&,duckdb::PhysicalHashAggregate_const&,duckdb::HashAggregateGlobalSinkState&>
            (&local_40.
              super___shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(HashAggregateDistinctFinalizeEvent **)&local_40,
             (allocator<duckdb::HashAggregateDistinctFinalizeEvent> *)&local_b1,local_a0,local_80,
             local_b0,local_a8);
  shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_true>::shared_ptr(&local_98,&local_40);
  if (local_40.
      super___shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super___shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_98.internal.
       super___shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = local_98.internal.
         super___shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  local_98.internal.
  super___shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_98.internal.
  super___shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Event::InsertEvent(local_78,&local_58);
  if (local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_98.internal.
      super___shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.internal.
               super___shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return READY;
}

Assistant:

SinkFinalizeType PhysicalHashAggregate::FinalizeDistinct(Pipeline &pipeline, Event &event, ClientContext &context,
                                                         GlobalSinkState &gstate_p) const {
	auto &gstate = gstate_p.Cast<HashAggregateGlobalSinkState>();
	D_ASSERT(distinct_collection_info);

	for (idx_t i = 0; i < groupings.size(); i++) {
		auto &grouping = groupings[i];
		auto &distinct_data = *grouping.distinct_data;
		auto &distinct_state = *gstate.grouping_states[i].distinct_state;

		for (idx_t table_idx = 0; table_idx < distinct_data.radix_tables.size(); table_idx++) {
			if (!distinct_data.radix_tables[table_idx]) {
				continue;
			}
			auto &radix_table = distinct_data.radix_tables[table_idx];
			auto &radix_state = *distinct_state.radix_states[table_idx];
			radix_table->Finalize(context, radix_state);
		}
	}
	auto new_event = make_shared_ptr<HashAggregateDistinctFinalizeEvent>(context, pipeline, *this, gstate);
	event.InsertEvent(std::move(new_event));
	return SinkFinalizeType::READY;
}